

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O0

void write1_cb(uv_write_t *req,int status)

{
  int iVar1;
  uv_buf_t uVar2;
  char *local_40;
  char *local_38;
  undefined1 auStack_28 [4];
  int r;
  uv_buf_t buf;
  int status_local;
  uv_write_t *req_local;
  
  buf.len._4_4_ = status;
  if (req == (uv_write_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x9e,"req != NULL");
    abort();
  }
  if (status == 0) {
    if (shutdown_requested == 0) {
      uVar2 = uv_buf_init("P",1);
      local_40 = uVar2.base;
      _auStack_28 = local_40;
      local_38 = (char *)uVar2.len;
      buf.base = local_38;
      iVar1 = uv_write(&write_req,req->handle,(uv_buf_t *)auStack_28,1,write1_cb);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
                ,0xa9,"r == 0");
        abort();
      }
      write_cb_called = write_cb_called + 1;
    }
  }
  else if (shutdown_cb_called == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0xa0,"shutdown_cb_called");
    abort();
  }
  return;
}

Assistant:

static void write1_cb(uv_write_t* req, int status) {
  uv_buf_t buf;
  int r;

  ASSERT(req != NULL);
  if (status) {
    ASSERT(shutdown_cb_called);
    return;
  }

  if (shutdown_requested)
    return;

  buf = uv_buf_init("P", 1);
  r = uv_write(&write_req, req->handle, &buf, 1, write1_cb);
  ASSERT(r == 0);

  write_cb_called++;
}